

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

size_t __thiscall
CoreML::Specification::LessEqualLayerParams::ByteSizeLong(LessEqualLayerParams *this)

{
  size_t sVar1;
  
  sVar1 = (ulong)(-(uint)(this->alpha_ != 0.0) & 1) * 5;
  this->_cached_size_ = (int)sVar1;
  return sVar1;
}

Assistant:

size_t LessEqualLayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.LessEqualLayerParams)
  size_t total_size = 0;

  // float alpha = 2;
  if (this->alpha() != 0) {
    total_size += 1 + 4;
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}